

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void aes_sw_setiv_sdctr(ssh_cipher *ciph,void *viv)

{
  ssh_cipheralg *psVar1;
  uint local_2c;
  uint i;
  uint8_t *iv;
  aes_sw_context *ctx;
  void *viv_local;
  ssh_cipher *ciph_local;
  
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    psVar1 = (ssh_cipheralg *)
             GET_64BIT_MSB_FIRST((void *)((long)viv + (8 - (ulong)(local_2c << 3))));
    ciph[(ulong)local_2c - 0xb].vt = psVar1;
  }
  ciph[-1].vt = (ssh_cipheralg *)(ciph + -1);
  return;
}

Assistant:

static void aes_sw_setiv_sdctr(ssh_cipher *ciph, const void *viv)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    const uint8_t *iv = (const uint8_t *)viv;

    /* Import the initial counter value into the internal representation */
    for (unsigned i = 0; i < SDCTR_WORDS; i++)
        ctx->iv.sdctr.counter[i] =
            GET_BIGNUMINT_MSB_FIRST(
                iv + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES);

    /* Set keystream_pos to indicate that the keystream cache is
     * currently empty */
    ctx->iv.sdctr.keystream_pos =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);
}